

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luac.c
# Opt level: O2

int pmain(lua_State *L)

{
  char cVar1;
  byte bVar2;
  uint uVar3;
  Instruction *pIVar4;
  LocVar *pLVar5;
  Upvaldesc *pUVar6;
  long lVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  void *pvVar12;
  char *pcVar13;
  FILE *__stream;
  ulong extraout_RAX;
  TString *pTVar14;
  char *pcVar15;
  uint uVar16;
  char *pcVar17;
  uint i;
  uint full;
  int iVar18;
  uint uVar19;
  code *pcVar20;
  Proto *f;
  char *pcVar21;
  char *pcVar22;
  char *pcVar23;
  ulong uVar24;
  long lVar25;
  uint uVar26;
  ulong uVar27;
  uint uVar28;
  uint uVar29;
  bool bVar30;
  uint local_2c;
  
  uVar27 = 0;
  uVar11 = lua_tointegerx(L,1,(int *)0x0);
  pvVar12 = lua_touserdata(L,2);
  uVar28 = (uint)uVar11;
  pcVar13 = (char *)(uVar11 & 0xffffffff);
  iVar8 = lua_checkstack(L,uVar28);
  full = (uint)pcVar13;
  if (iVar8 == 0) {
    fatal("too many input files");
LAB_00104823:
    cannot("open");
  }
  else {
    uVar24 = 0;
    if (0 < (int)uVar28) {
      uVar24 = uVar11 & 0xffffffff;
    }
    do {
      full = (uint)pcVar13;
      if (uVar24 == uVar27) goto LAB_001046e4;
      pcVar13 = *(char **)((long)pvVar12 + uVar27 * 8);
      if ((*pcVar13 == '-') && (pcVar13[1] == '\0')) {
        pcVar13 = (char *)0x0;
      }
      iVar8 = luaL_loadfilex(L,pcVar13,(char *)0x0);
      uVar27 = uVar27 + 1;
    } while (iVar8 == 0);
    do {
      full = 0xffffffff;
      pcVar13 = lua_tolstring(L,-1,(size_t *)0x0);
      fatal(pcVar13);
LAB_001046e4:
      if (uVar28 == 1) {
        f = *(Proto **)(L->top[-1].value_.f + 0x18);
        goto LAB_00104782;
      }
      pcVar20 = reader;
      local_2c = uVar28;
      iVar8 = lua_load(L,reader,&local_2c,"=(luac)",(char *)0x0);
    } while (iVar8 != 0);
    f = *(Proto **)(L->top[-1].value_.f + 0x18);
    lVar25 = (ulong)~uVar28 << 0x20;
    for (uVar11 = 0; full = (uint)pcVar20, uVar24 != uVar11; uVar11 = uVar11 + 1) {
      pcVar20 = (code *)f->p;
      *(Proto **)((long)pcVar20 + uVar11 * 8) =
           *(Proto **)(*(long *)((long)&L->top->value_ + (lVar25 >> 0x1c)) + 0x18);
      if (0 < f->p[uVar11]->sizeupvalues) {
        f->p[uVar11]->upvalues->instack = '\0';
      }
      lVar25 = lVar25 + 0x100000000;
    }
    f->sizelineinfo = 0;
LAB_00104782:
    if (listing != 0) {
      full = (uint)(1 < listing);
      PrintFunction(f,(uint)(1 < listing));
    }
    if (dumping != '\0') {
      return 0;
    }
    __stream = _stdout;
    if (output != (char *)0x0) {
      full = 0x11632f;
      __stream = fopen64(output,"wb");
    }
    if (__stream == (FILE *)0x0) goto LAB_00104823;
    luaU_dump(L,f,writer,__stream,(uint)stripping);
    full = (uint)f;
    iVar8 = ferror(__stream);
    if (iVar8 == 0) {
      iVar8 = fclose(__stream);
      if (iVar8 == 0) {
        return 0;
      }
      goto LAB_0010483b;
    }
  }
  cannot("write");
LAB_0010483b:
  pcVar13 = "close";
  cannot("close");
  pTVar14 = (TString *)"=?";
  if (((Proto *)pcVar13)->source != (TString *)0x0) {
    pTVar14 = ((Proto *)pcVar13)->source + 1;
  }
  cVar1 = *(char *)&pTVar14->next;
  if (cVar1 == '\x1b') {
    pcVar15 = "(bstring)";
  }
  else if ((cVar1 == '@') || (cVar1 == '=')) {
    pcVar15 = (char *)((long)&pTVar14->next + 1);
  }
  else {
    pcVar15 = "(string)";
  }
  uVar28 = ((Proto *)pcVar13)->sizep;
  pcVar21 = "function";
  if (((Proto *)pcVar13)->linedefined == 0) {
    pcVar21 = "main";
  }
  pcVar17 = "s";
  pcVar22 = "s";
  if (((Proto *)pcVar13)->sizecode == 1) {
    pcVar22 = "";
  }
  printf("\n%s <%s:%d,%d> (%d instruction%s at %p)\n",pcVar21,pcVar15,
         (ulong)(uint)((Proto *)pcVar13)->linedefined,
         (ulong)(uint)((Proto *)pcVar13)->lastlinedefined,(ulong)(uint)((Proto *)pcVar13)->sizecode,
         pcVar22,pcVar13);
  pcVar15 = "+";
  if (((Proto *)pcVar13)->is_vararg == '\0') {
    pcVar15 = "";
  }
  pcVar21 = "s";
  if (((Proto *)pcVar13)->numparams == 1) {
    pcVar21 = "";
  }
  pcVar22 = "s";
  if (((Proto *)pcVar13)->maxstacksize == 1) {
    pcVar22 = "";
  }
  pcVar23 = "s";
  if (((Proto *)pcVar13)->sizeupvalues == 1) {
    pcVar23 = "";
  }
  printf("%d%s param%s, %d slot%s, %d upvalue%s, ",(ulong)((Proto *)pcVar13)->numparams,pcVar15,
         pcVar21,(ulong)((Proto *)pcVar13)->maxstacksize,pcVar22,
         (ulong)(uint)((Proto *)pcVar13)->sizeupvalues,pcVar23);
  pcVar15 = "s";
  if (((Proto *)pcVar13)->sizelocvars == 1) {
    pcVar15 = "";
  }
  pcVar21 = "s";
  if (((Proto *)pcVar13)->sizek == 1) {
    pcVar21 = "";
  }
  if (((Proto *)pcVar13)->sizep == 1) {
    pcVar17 = "";
  }
  printf("%d local%s, %d constant%s, %d function%s\n",(ulong)(uint)((Proto *)pcVar13)->sizelocvars,
         pcVar15,(ulong)(uint)((Proto *)pcVar13)->sizek,pcVar21,
         (ulong)(uint)((Proto *)pcVar13)->sizep,pcVar17,pcVar23);
  pIVar4 = ((Proto *)pcVar13)->code;
  uVar16 = ((Proto *)pcVar13)->sizecode;
  uVar10 = uVar16;
  iVar8 = 0;
  do {
    if ((int)uVar16 <= iVar8) {
      if (full != 0) {
        uVar16 = ((Proto *)pcVar13)->sizek;
        printf("constants (%d) for %p:\n",(ulong)uVar16,pcVar13);
        if ((int)uVar16 < 1) {
          uVar16 = 0;
        }
        uVar10 = 0;
        while (bVar30 = uVar16 != 0, uVar16 = uVar16 - 1, bVar30) {
          printf("\t%d\t",(ulong)(uVar10 + 1));
          PrintConstant((Proto *)pcVar13,uVar10);
          putchar(10);
          uVar10 = uVar10 + 1;
        }
        uVar16 = ((Proto *)pcVar13)->sizelocvars;
        printf("locals (%d) for %p:\n",(ulong)uVar16,pcVar13);
        uVar11 = (ulong)uVar16;
        if ((int)uVar16 < 1) {
          uVar11 = 0;
        }
        lVar25 = 0xc;
        for (uVar27 = 0; uVar11 != uVar27; uVar27 = uVar27 + 1) {
          pLVar5 = ((Proto *)pcVar13)->locvars;
          printf("\t%d\t%s\t%d\t%d\n",uVar27 & 0xffffffff,
                 *(long *)((long)pLVar5 + lVar25 + -0xc) + 0x18,
                 (ulong)(*(int *)((long)pLVar5 + lVar25 + -4) + 1),
                 (ulong)(*(int *)((long)&pLVar5->varname + lVar25) + 1));
          lVar25 = lVar25 + 0x10;
        }
        uVar16 = ((Proto *)pcVar13)->sizeupvalues;
        uVar10 = printf("upvalues (%d) for %p:\n",(ulong)uVar16,pcVar13);
        uVar11 = (ulong)uVar16;
        if ((int)uVar16 < 1) {
          uVar11 = 0;
        }
        lVar25 = 9;
        for (uVar27 = 0; uVar11 != uVar27; uVar27 = uVar27 + 1) {
          pUVar6 = ((Proto *)pcVar13)->upvalues;
          lVar7 = *(long *)((long)pUVar6 + lVar25 + -9);
          pcVar15 = (char *)(lVar7 + 0x18);
          if (lVar7 == 0) {
            pcVar15 = "-";
          }
          uVar10 = printf("\t%d\t%s\t%d\t%d\n",uVar27 & 0xffffffff,pcVar15,
                          (ulong)*(byte *)((long)pUVar6 + lVar25 + -1),
                          (ulong)*(byte *)((long)&pUVar6->name + lVar25));
          lVar25 = lVar25 + 0x10;
        }
      }
      uVar11 = (ulong)uVar10;
      uVar24 = 0;
      uVar27 = (ulong)uVar28;
      if ((int)uVar28 < 1) {
        uVar27 = uVar24;
      }
      for (; uVar27 != uVar24; uVar24 = uVar24 + 1) {
        PrintFunction(((Proto *)pcVar13)->p[uVar24],full);
        uVar11 = extraout_RAX;
      }
      return (int)uVar11;
    }
    uVar10 = 0xffffffff;
    if (((Proto *)pcVar13)->lineinfo != (int *)0x0) {
      uVar10 = ((Proto *)pcVar13)->lineinfo[iVar8];
    }
    uVar3 = pIVar4[iVar8];
    iVar18 = iVar8 + 1;
    printf("\t%d\t");
    if ((int)uVar10 < 1) {
      printf("[-]\t");
    }
    else {
      printf("[%d]\t",(ulong)uVar10);
    }
    uVar29 = uVar3 & 0x3f;
    uVar26 = uVar3 >> 6;
    uVar11 = (ulong)(uVar26 & 0xff);
    uVar9 = uVar3 >> 0x17;
    i = uVar3 >> 0xe;
    uVar10 = i & 0x1ff;
    printf("%-9s\t",luaP_opnames[uVar29]);
    bVar2 = luaP_opmodes[uVar29];
    switch(bVar2 & 3) {
    case 0:
      printf("%d",uVar11);
      if ((bVar2 & 0x30) != 0) {
        uVar19 = ~uVar9 | 0xffffff00;
        if (-1 < (int)uVar3) {
          uVar19 = uVar9;
        }
        printf(" %d",(ulong)uVar19);
      }
      if ((bVar2 & 0xc) != 0) {
        uVar19 = ~i | 0xffffff00;
        if ((uVar3 >> 0x16 & 1) == 0) {
          uVar19 = uVar10;
        }
LAB_00104b19:
        pcVar15 = " %d";
        goto LAB_00104b22;
      }
      break;
    case 1:
      printf("%d",uVar11);
      if ((bVar2 & 0x30) == 0x10) {
        printf(" %d",(ulong)i);
      }
      else {
        uVar19 = ~i;
        if ((bVar2 & 0x30) == 0x30) goto LAB_00104b19;
      }
      break;
    case 2:
      printf("%d %d",uVar11,(ulong)(i - 0x1ffff));
      break;
    case 3:
      uVar19 = ~uVar26;
      pcVar15 = "%d";
LAB_00104b22:
      printf(pcVar15,(ulong)uVar19);
    }
    switch(uVar29) {
    case 1:
      printf("\t; ");
      goto LAB_00104d28;
    case 5:
    case 9:
      lVar25 = *(long *)((long)&((Proto *)pcVar13)->upvalues->name + (ulong)(uVar9 << 4));
      pcVar15 = "-";
      if (lVar25 != 0) {
        pcVar15 = (char *)(lVar25 + 0x18);
      }
      pcVar21 = "\t; %s";
      goto LAB_00104c40;
    case 6:
      lVar25 = *(long *)((long)&((Proto *)pcVar13)->upvalues->name + (ulong)(uVar9 << 4));
      pcVar15 = (char *)(lVar25 + 0x18);
      if (lVar25 == 0) {
        pcVar15 = "-";
      }
      printf("\t; %s",pcVar15);
      goto LAB_00104d11;
    case 7:
    case 0xc:
      if ((uVar3 >> 0x16 & 1) == 0) break;
      printf("\t; ");
      goto LAB_00104d20;
    case 8:
      lVar25 = *(long *)((long)&((Proto *)pcVar13)->upvalues->name + (ulong)((uVar26 & 0xff) << 4));
      pcVar15 = "-";
      if (lVar25 != 0) {
        pcVar15 = (char *)(lVar25 + 0x18);
      }
      printf("\t; %s",pcVar15);
      if ((int)uVar3 < 0) {
        putchar(0x20);
        PrintConstant((Proto *)pcVar13,uVar9 & 0xff);
      }
LAB_00104d11:
      if ((uVar3 >> 0x16 & 1) != 0) {
        putchar(0x20);
LAB_00104d20:
        i = i & 0xff;
        goto LAB_00104d28;
      }
      break;
    case 10:
    case 0xd:
    case 0xe:
    case 0xf:
    case 0x11:
    case 0x12:
    case 0x13:
    case 0x14:
    case 0x15:
    case 0x16:
    case 0x17:
    case 0x18:
    case 0x1f:
    case 0x20:
    case 0x21:
      if ((uVar3 & 0x80400000) != 0) {
        printf("\t; ");
        if ((int)uVar3 < 0) {
          PrintConstant((Proto *)pcVar13,uVar9 & 0xff);
        }
        else {
          putchar(0x2d);
        }
        putchar(0x20);
        if ((uVar3 >> 0x16 & 1) != 0) goto LAB_00104d20;
        putchar(0x2d);
      }
      break;
    case 0x1e:
    case 0x27:
    case 0x28:
    case 0x2a:
      uVar10 = iVar8 + (i - 0x1ffff) + 2;
      pcVar15 = "\t; to %d";
LAB_00104b8c:
      printf(pcVar15,(ulong)uVar10);
      break;
    case 0x2b:
      if (uVar10 != 0) {
        pcVar15 = "\t; %d";
        goto LAB_00104b8c;
      }
      printf("\t; %d",(ulong)pIVar4[iVar18]);
      iVar18 = iVar8 + 2;
      goto LAB_00104d31;
    case 0x2c:
      pcVar15 = (char *)((Proto *)pcVar13)->p[i];
      pcVar21 = "\t; %p";
LAB_00104c40:
      printf(pcVar21,pcVar15);
      break;
    case 0x2e:
      printf("\t; ");
      i = uVar26;
LAB_00104d28:
      PrintConstant((Proto *)pcVar13,i);
    }
LAB_00104d31:
    uVar10 = putchar(10);
    iVar8 = iVar18;
  } while( true );
}

Assistant:

static int pmain(lua_State *L) {
    int argc = (int) lua_tointeger(L, 1);
    char **argv = (char **) lua_touserdata(L, 2);
    const Proto *f;
    int i;
    if (!lua_checkstack(L, argc)) fatal("too many input files");
    for (i = 0; i < argc; i++) {
        const char *filename = IS("-") ? NULL : argv[i];
        if (luaL_loadfile(L, filename) != LUA_OK) fatal(lua_tostring(L, -1));
    }
    f = combine(L, argc);
    if (listing) luaU_print(f, listing > 1);
    if (dumping) {
        FILE *D = (output == NULL) ? stdout : fopen(output, "wb");
        if (D == NULL) cannot("open");
        lua_lock(L);
        luaU_dump(L, f, writer, D, stripping);
        lua_unlock(L);
        if (ferror(D)) cannot("write");
        if (fclose(D)) cannot("close");
    }
    return 0;
}